

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<6UL>
mserialize::cx_strcat<2ul,1ul,1ul,2ul>
          (cx_string<2UL> *strings,cx_string<1UL> *strings_1,cx_string<1UL> *strings_2,
          cx_string<2UL> *strings_3)

{
  cx_string<6UL> cVar1;
  cx_string<2UL> *in_RCX;
  cx_string<1UL> *in_RDX;
  cx_string<1UL> *in_RSI;
  cx_string<2UL> *in_RDI;
  size_t s;
  size_t i;
  char *out;
  size_t size [5];
  char *data [5];
  char buffer [7];
  ulong local_a0;
  ulong local_98;
  char *local_90;
  size_t local_80 [5];
  char *local_58;
  data_ref local_50;
  data_ref local_48;
  data_ref local_40;
  data_ref local_38;
  char local_2f [7];
  cx_string<2UL> *local_28;
  cx_string<1UL> *local_20;
  cx_string<1UL> *local_18;
  cx_string<2UL> *local_10;
  cx_string<6UL> local_7;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_2f,0,7);
  local_58 = "";
  local_50 = cx_string<2UL>::data(local_10);
  local_48 = cx_string<1UL>::data(local_18);
  local_40 = cx_string<1UL>::data(local_20);
  local_38 = cx_string<2UL>::data(local_28);
  local_80[0] = cx_string<2UL>::size(local_10);
  local_80[1] = cx_string<1UL>::size(local_18);
  local_80[2] = cx_string<1UL>::size(local_20);
  local_80[3] = cx_string<2UL>::size(local_28);
  local_90 = local_2f;
  for (local_98 = 1; local_98 < 5; local_98 = local_98 + 1) {
    for (local_a0 = 0; local_a0 < local_80[local_98 - 1]; local_a0 = local_a0 + 1) {
      *local_90 = (&local_58)[local_98][local_a0];
      local_90 = local_90 + 1;
    }
  }
  cx_string<6UL>::cx_string(&local_7,local_2f);
  cVar1._data[0] = local_7._data[0];
  cVar1._data[1] = local_7._data[1];
  cVar1._data[2] = local_7._data[2];
  cVar1._data[3] = local_7._data[3];
  cVar1._data[4] = local_7._data[4];
  cVar1._data[5] = local_7._data[5];
  cVar1._data[6] = local_7._data[6];
  return (cx_string<6UL>)cVar1._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}